

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O1

ColumnBinding __thiscall
duckdb::TableBinding::GetColumnBinding(TableBinding *this,column_t column_index)

{
  vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>> *this_00;
  reference pvVar1;
  size_type __n;
  size_type sVar2;
  size_type sVar3;
  ColumnBinding CVar4;
  idx_t local_28;
  
  this_00 = (vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>> *)
            this->bound_column_ids;
  sVar2 = *(long *)(this_00 + 8) - *(long *)this_00 >> 5;
  sVar3 = sVar2;
  local_28 = column_index;
  if (*(long *)(this_00 + 8) != *(long *)this_00) {
    __n = 0;
    do {
      pvVar1 = vector<duckdb::ColumnIndex,_true>::operator[]
                         ((vector<duckdb::ColumnIndex,_true> *)this_00,__n);
      sVar3 = __n;
      if (pvVar1->index == local_28) break;
      __n = __n + 1;
      sVar3 = sVar2;
    } while (__n < (ulong)(*(long *)(this_00 + 8) - *(long *)this_00 >> 5));
  }
  if (sVar3 == *(long *)(this_00 + 8) - *(long *)this_00 >> 5) {
    ::std::vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>>::
    emplace_back<unsigned_long&>(this_00,&local_28);
  }
  CVar4.column_index = sVar3;
  CVar4.table_index = (this->super_Binding).index;
  return CVar4;
}

Assistant:

ColumnBinding TableBinding::GetColumnBinding(column_t column_index) {
	auto &column_ids = bound_column_ids;
	ColumnBinding binding;

	// Locate the column_id that matches the 'column_index'
	binding.column_index = column_ids.size();
	for (idx_t i = 0; i < column_ids.size(); ++i) {
		auto &col_id = column_ids[i];
		if (col_id.GetPrimaryIndex() == column_index) {
			binding.column_index = i;
			break;
		}
	}
	// If it wasn't found, add it
	if (binding.column_index == column_ids.size()) {
		column_ids.emplace_back(column_index);
	}

	binding.table_index = index;
	return binding;
}